

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

int SSL_CTX_set1_requested_trust_anchors(SSL_CTX *ctx,uint8_t *ids,size_t ids_len)

{
  bool bVar1;
  uint uVar2;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  Array<unsigned_char> copy;
  
  in.size_ = ids_len;
  in.data_ = (uchar *)ids_len;
  bVar1 = bssl::ssl_is_valid_trust_anchor_list((bssl *)ids,in);
  if (bVar1) {
    copy.data_ = (uchar *)0x0;
    copy.size_ = 0;
    in_00.size_ = ids_len;
    in_00.data_ = ids;
    bVar1 = bssl::Array<unsigned_char>::CopyFrom(&copy,in_00);
    if (bVar1) {
      std::optional<bssl::Array<unsigned_char>>::operator=
                ((optional<bssl::Array<unsigned_char>> *)&ctx->requested_trust_anchors,&copy);
    }
    uVar2 = (uint)bVar1;
    bssl::Array<unsigned_char>::~Array(&copy);
  }
  else {
    uVar2 = 0;
    ERR_put_error(0x10,0,0x148,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                  ,0xd58);
  }
  return uVar2;
}

Assistant:

int SSL_CTX_set1_requested_trust_anchors(SSL_CTX *ctx, const uint8_t *ids,
                                         size_t ids_len) {
  auto span = Span(ids, ids_len);
  if (!ssl_is_valid_trust_anchor_list(span)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_TRUST_ANCHOR_LIST);
    return 0;
  }
  Array<uint8_t> copy;
  if (!copy.CopyFrom(span)) {
    return 0;
  }
  ctx->requested_trust_anchors = std::move(copy);
  return 1;
}